

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall
QIconModeViewBase::doDynamicLayout(QIconModeViewBase *this,QListViewLayoutInfo *info)

{
  QSize *pQVar1;
  Representation *pRVar2;
  QPoint QVar3;
  bool bVar4;
  char cVar5;
  P _a;
  int iVar6;
  QPoint QVar7;
  pointer pQVar8;
  QSize QVar9;
  short sVar10;
  int iVar11;
  int iVar12;
  Representation RVar13;
  QListViewLayoutInfo *pQVar14;
  QSize *pQVar15;
  long lVar16;
  Representation RVar17;
  ulong uVar18;
  Representation RVar19;
  QSize *pQVar20;
  QSize *pQVar21;
  char *pcVar22;
  int iVar23;
  QListViewItem *pQVar24;
  int iVar25;
  QPoint QVar26;
  long lVar27;
  long in_FS_OFFSET;
  bool bVar28;
  Representation RVar29;
  Representation RVar31;
  undefined1 auVar30 [16];
  QListViewItem *local_a8;
  ulong local_a0;
  QRect local_68;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &info->grid;
  pRVar2 = &(info->grid).ht;
  bVar28 = -1 < ((info->grid).ht.m_i | (info->grid).wd.m_i);
  QVar7 = initDynamicLayout(this,info);
  QVar26 = (QPoint)((ulong)QVar7 >> 0x20);
  local_48.y2.m_i = (int)QVar7.yp.m_i;
  local_48.x2.m_i = (int)QVar7.xp.m_i;
  if (info->flow == LeftToRight) {
    lVar16 = 8;
    pQVar14 = info;
    pQVar15 = pQVar1;
    pQVar20 = (QSize *)pRVar2;
    QVar3 = QVar7;
  }
  else {
    lVar16 = 0xc;
    pQVar14 = (QListViewLayoutInfo *)&(info->bounds).y1;
    pQVar15 = (QSize *)pRVar2;
    pQVar20 = pQVar1;
    QVar3 = QVar26;
    QVar26 = QVar7;
  }
  local_a0 = (ulong)QVar26 & 0xffffffff;
  uVar18 = (ulong)QVar3 & 0xffffffff;
  pQVar21 = (QSize *)&(this->super_QCommonListViewBase).batchSavedDeltaSeg;
  if (bVar28) {
    pQVar21 = pQVar20;
  }
  pcVar22 = (this->moved).d.d.ptr;
  if (pcVar22 == (char *)0x0) {
    pcVar22 = (char *)&QByteArray::_empty;
  }
  iVar23 = info->spacing + (pQVar14->bounds).x1.m_i;
  iVar6 = *(int *)((long)&(info->bounds).x1.m_i + lVar16);
  iVar12 = (pQVar15->wd).m_i;
  iVar25 = (pQVar21->wd).m_i;
  if ((this->moved).d.d.size * 8 - (long)*pcVar22 != (this->items).d.size) {
    QBitArray::resize((longlong)&this->moved);
  }
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  lVar27 = (long)info->first;
  lVar16 = lVar27 * 0x14;
  local_a8 = (QListViewItem *)0x0;
  while( true ) {
    RVar17.m_i = (int)uVar18;
    iVar11 = info->last;
    if (iVar11 < lVar27) break;
    pQVar8 = QList<QListViewItem>::data(&this->items);
    local_a8 = (QListViewItem *)((long)&pQVar8->x + lVar16);
    bVar4 = QCommonListViewBase::isHidden(&this->super_QCommonListViewBase,(uint)lVar27);
    if (bVar4) {
      *(undefined8 *)((long)&pQVar8->x + lVar16) = 0xffffffffffffffff;
      *(undefined4 *)((long)&pQVar8->w + lVar16) = 0;
    }
    else {
      if (bVar28) {
        iVar11 = (pQVar1->wd).m_i;
        sVar10 = *(short *)((long)&pQVar8->w + lVar16);
        if (iVar11 < sVar10) {
          sVar10 = (short)iVar11;
        }
        *(short *)((long)&pQVar8->w + lVar16) = sVar10;
        iVar11 = (int)*(short *)((long)&pQVar8->h + lVar16);
        if (pRVar2->m_i < iVar11) {
          iVar11 = pRVar2->m_i;
        }
        *(short *)((long)&pQVar8->h + lVar16) = (short)iVar11;
      }
      else {
        if (info->flow == LeftToRight) {
          sVar10 = *(short *)((long)&pQVar8->w + lVar16);
        }
        else {
          sVar10 = *(short *)((long)&pQVar8->h + lVar16);
        }
        iVar12 = info->spacing + (int)sVar10;
      }
      iVar11 = iVar25;
      if (((info->wrap == true) && (iVar6 < iVar12 + RVar17.m_i)) && (iVar23 < RVar17.m_i)) {
        local_a0 = (ulong)(uint)((int)local_a0 + iVar25);
        iVar11 = 0;
        RVar17.m_i = iVar23;
      }
      if ((!bVar28) &&
         (iVar25 = (int)*(short *)((long)&pQVar8->w +
                                  lVar16 + (ulong)(info->flow == LeftToRight) * 2) + info->spacing,
         iVar25 < iVar11)) {
        iVar25 = iVar11;
      }
      RVar19.m_i = (int)local_a0;
      if (((byte)(this->moved).d.d.ptr[(lVar27 >> 3) + 1] >> ((uint)lVar27 & 7) & 1) == 0) {
        if (info->flow == LeftToRight) {
          if (bVar28) {
            *(int *)((long)&pQVar8->x + lVar16) =
                 (iVar12 - *(short *)((long)&pQVar8->w + lVar16)) / 2 + RVar17.m_i;
            *(int *)((long)&pQVar8->y + lVar16) = RVar19.m_i;
            goto LAB_0051982e;
          }
          local_a8->x = RVar17.m_i;
          pQVar24 = (QListViewItem *)&pQVar8[lVar27].y;
        }
        else {
          if (bVar28) {
            *(int *)((long)&pQVar8->y + lVar16) =
                 (iVar12 - *(short *)((long)&pQVar8->h + lVar16)) / 2 + RVar17.m_i;
            *(int *)((long)&pQVar8->x + lVar16) = RVar19.m_i;
            goto LAB_005197ed;
          }
          *(int *)((long)&pQVar8->y + lVar16) = RVar17.m_i;
          pQVar24 = local_a8;
        }
        pQVar24->x = RVar19.m_i;
LAB_00519880:
        local_58 = QListViewItem::rect(local_a8);
        QRect::operator|=(&local_48,&local_58);
      }
      else {
        if (!bVar28) goto LAB_00519880;
        if (info->flow == LeftToRight) {
LAB_0051982e:
          local_58.y1.m_i = RVar19.m_i;
          local_58.x1.m_i = RVar17.m_i;
          local_58.x2.m_i = iVar12 + RVar17.m_i + -1;
          iVar11 = RVar19.m_i + iVar25;
        }
        else {
LAB_005197ed:
          local_58.y1.m_i = RVar17.m_i;
          local_58.x1.m_i = RVar19.m_i;
          local_58.x2.m_i = RVar19.m_i + iVar25 + -1;
          iVar11 = iVar12 + RVar17.m_i;
        }
        local_58.y2.m_i = iVar11 + -1;
        QRect::operator|=(&local_48,&local_58);
      }
      uVar18 = (ulong)(uint)(RVar17.m_i + iVar12);
    }
    lVar27 = lVar27 + 1;
    lVar16 = lVar16 + 0x14;
  }
  (this->super_QCommonListViewBase).batchSavedDeltaSeg = iVar25;
  (this->super_QCommonListViewBase).batchStartRow = iVar11 + 1;
  iVar6 = QCommonListViewBase::rowCount(&this->super_QCommonListViewBase);
  if (iVar11 < iVar6 + -1) {
    local_58 = QListViewItem::rect(local_a8);
    cVar5 = QRect::contains(&info->bounds,SUB81(&local_58,0));
    if (cVar5 != '\0') {
      RVar29.m_i = (local_48.x2.m_i - local_48.x1.m_i) + 1;
      RVar31.m_i = (local_48.y2.m_i - local_48.y1.m_i) + 1;
      QVar9.ht.m_i = RVar31.m_i;
      QVar9.wd.m_i = RVar29.m_i;
      RVar13.m_i = 0;
      goto LAB_00519986;
    }
  }
  RVar29.m_i = (local_48.x2.m_i - local_48.x1.m_i) + 1;
  RVar31.m_i = (local_48.y2.m_i - local_48.y1.m_i) + 1;
  QVar9.ht.m_i = RVar31.m_i;
  QVar9.wd.m_i = RVar29.m_i;
  (this->super_QCommonListViewBase).contentsSize = QVar9;
  if (info->flow == LeftToRight) {
    (this->super_QCommonListViewBase).contentsSize.ht.m_i = RVar31.m_i + info->spacing;
    RVar13.m_i = RVar29.m_i;
  }
  else {
    RVar13.m_i = RVar29.m_i + info->spacing;
    (this->super_QCommonListViewBase).contentsSize.wd.m_i = RVar13.m_i;
  }
LAB_00519986:
  auVar30._0_4_ = -(uint)(0 < RVar29.m_i);
  auVar30._4_4_ = -(uint)(0 < RVar29.m_i);
  auVar30._8_4_ = -(uint)(0 < RVar31.m_i);
  auVar30._12_4_ = -(uint)(0 < RVar31.m_i);
  iVar12 = movmskpd(RVar13.m_i,auVar30);
  if (iVar12 == 3) {
    iVar12 = info->first;
    if (iVar12 == 0 || iVar6 + -1 <= iVar11) {
      local_58.x1.m_i = QVar9.wd.m_i;
      local_58.y1.m_i = QVar9.ht.m_i;
      initBspTree(this,(QSize *)&local_58);
      iVar12 = 0;
    }
    lVar27 = (long)iVar12;
    lVar16 = lVar27 * 0x14;
    for (; lVar27 <= info->last; lVar27 = lVar27 + 1) {
      local_58 = QListViewItem::rect((QListViewItem *)((long)&((this->items).d.ptr)->x + lVar16));
      QBspTree::insertLeaf(&this->tree,&local_58,(int)lVar27);
      lVar16 = lVar16 + 0x14;
    }
    local_58.x2.m_i = local_48.x2.m_i;
    local_58.x1.m_i = QVar7.xp.m_i;
    local_58.y1.m_i = QVar7.yp.m_i;
    local_58.y2.m_i = local_48.y2.m_i;
    local_68 = QCommonListViewBase::clipRect(&this->super_QCommonListViewBase);
    cVar5 = QRect::intersects(&local_68);
    if (cVar5 != '\0') {
      QWidget::update((((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
                      super_QAbstractScrollAreaPrivate.viewport);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIconModeViewBase::doDynamicLayout(const QListViewLayoutInfo &info)
{
    const bool useItemSize = !info.grid.isValid();
    const QPoint topLeft = initDynamicLayout(info);

    int segStartPosition;
    int segEndPosition;
    int deltaFlowPosition;
    int deltaSegPosition;
    int deltaSegHint;
    int flowPosition;
    int segPosition;

    if (info.flow == QListView::LeftToRight) {
        segStartPosition = info.bounds.left() + info.spacing;
        segEndPosition = info.bounds.right();
        deltaFlowPosition = info.grid.width(); // dx
        deltaSegPosition = (useItemSize ? batchSavedDeltaSeg : info.grid.height()); // dy
        deltaSegHint = info.grid.height();
        flowPosition = topLeft.x();
        segPosition = topLeft.y();
    } else { // flow == QListView::TopToBottom
        segStartPosition = info.bounds.top() + info.spacing;
        segEndPosition = info.bounds.bottom();
        deltaFlowPosition = info.grid.height(); // dy
        deltaSegPosition = (useItemSize ? batchSavedDeltaSeg : info.grid.width()); // dx
        deltaSegHint = info.grid.width();
        flowPosition = topLeft.y();
        segPosition = topLeft.x();
    }

    if (moved.size() != items.size())
        moved.resize(items.size());

    QRect rect(QPoint(), topLeft);
    QListViewItem *item = nullptr;
    Q_ASSERT(info.first <= info.last);
    for (int row = info.first; row <= info.last; ++row) {
        item = &items[row];
        if (isHidden(row)) {
            item->invalidate();
        } else {
            // if we are not using a grid, we need to find the deltas
            if (useItemSize) {
                if (info.flow == QListView::LeftToRight)
                    deltaFlowPosition = item->w + info.spacing;
                else
                    deltaFlowPosition = item->h + info.spacing;
            } else {
                item->w = qMin<int>(info.grid.width(), item->w);
                item->h = qMin<int>(info.grid.height(), item->h);
            }

            // create new segment
            if (info.wrap
                && flowPosition + deltaFlowPosition > segEndPosition
                && flowPosition > segStartPosition) {
                flowPosition = segStartPosition;
                segPosition += deltaSegPosition;
                if (useItemSize)
                    deltaSegPosition = 0;
            }
            // We must delay calculation of the seg adjustment, as this item
            // may have caused a wrap to occur
            if (useItemSize) {
                if (info.flow == QListView::LeftToRight)
                    deltaSegHint = item->h + info.spacing;
                else
                    deltaSegHint = item->w + info.spacing;
                deltaSegPosition = qMax(deltaSegPosition, deltaSegHint);
            }

            // set the position of the item
            // ### idealy we should have some sort of alignment hint for the item
            // ### (normally that would be a point between the icon and the text)
            if (!moved.testBit(row)) {
                if (info.flow == QListView::LeftToRight) {
                    if (useItemSize) {
                        item->x = flowPosition;
                        item->y = segPosition;
                    } else { // use grid
                        item->x = flowPosition + ((deltaFlowPosition - item->w) / 2);
                        item->y = segPosition;
                    }
                } else { // TopToBottom
                    if (useItemSize) {
                        item->y = flowPosition;
                        item->x = segPosition;
                    } else { // use grid
                        item->y = flowPosition + ((deltaFlowPosition - item->h) / 2);
                        item->x = segPosition;
                    }
                }
            }

            // let the contents contain the new item
            if (useItemSize)
                rect |= item->rect();
            else if (info.flow == QListView::LeftToRight)
                rect |= QRect(flowPosition, segPosition, deltaFlowPosition, deltaSegPosition);
            else // flow == TopToBottom
                rect |= QRect(segPosition, flowPosition, deltaSegPosition, deltaFlowPosition);

            // prepare for next item
            flowPosition += deltaFlowPosition; // current position + item width + gap
        }
    }
    Q_ASSERT(item);
    batchSavedDeltaSeg = deltaSegPosition;
    batchStartRow = info.last + 1;
    bool done = (info.last >= rowCount() - 1);
    // resize the content area
    if (done || !info.bounds.contains(item->rect())) {
        contentsSize = rect.size();
        if (info.flow == QListView::LeftToRight)
            contentsSize.rheight() += info.spacing;
        else
            contentsSize.rwidth() += info.spacing;
    }
    if (rect.size().isEmpty())
        return;
    // resize tree
    int insertFrom = info.first;
    if (done || info.first == 0) {
        initBspTree(rect.size());
        insertFrom = 0;
    }
    // insert items in tree
    for (int row = insertFrom; row <= info.last; ++row)
        tree.insertLeaf(items.at(row).rect(), row);
    // if the new items are visible, update the viewport
    QRect changedRect(topLeft, rect.bottomRight());
    if (clipRect().intersects(changedRect))
        viewport()->update();
}